

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TiledOutputFile::setFrameBuffer(TiledOutputFile *this,FrameBuffer *frameBuffer)

{
  PixelType t;
  size_t xs;
  size_t ys;
  bool bVar1;
  undefined1 uVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined8 uVar5;
  const_iterator this_00;
  Channel *pCVar6;
  Slice *pSVar7;
  ConstIterator j_1;
  ConstIterator i_1;
  vector<Imf_3_3::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::TOutSliceInfo>_>
  slices;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  ConstIterator j;
  ConstIterator i;
  ChannelList *channels;
  lock_guard<std::mutex> lock;
  uint in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  uint in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  undefined4 in_stack_fffffffffffffab0;
  uint in_stack_fffffffffffffab4;
  undefined7 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffba0;
  PixelType in_stack_fffffffffffffba4;
  Slice *in_stack_fffffffffffffba8;
  TOutSliceInfo local_3f8;
  TOutSliceInfo local_3c8;
  const_iterator local_398;
  const_iterator local_390;
  const_iterator local_388;
  const_iterator local_380;
  stringstream local_360 [16];
  ostream local_350 [376];
  stringstream local_1d8 [16];
  ostream local_1c8 [376];
  const_iterator local_50;
  const_iterator local_48;
  const_iterator local_40;
  const_iterator local_38;
  ChannelList *local_20;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0)
             ,(mutex_type *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
  local_20 = Header::channels((Header *)0x16f9e9);
  local_38._M_node =
       (_Base_ptr)
       ChannelList::begin((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
  do {
    local_40._M_node =
         (_Base_ptr)
         ChannelList::end((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    bVar1 = Imf_3_3::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    if (!bVar1) {
      std::
      vector<Imf_3_3::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::TOutSliceInfo>_>
      ::vector((vector<Imf_3_3::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::TOutSliceInfo>_>
                *)0x16fe30);
      local_380._M_node =
           (_Base_ptr)
           ChannelList::begin((ChannelList *)
                              CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      while( true ) {
        this_00._M_node =
             (_Base_ptr)
             ChannelList::end((ChannelList *)
                              CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        local_388._M_node = this_00._M_node;
        uVar2 = Imf_3_3::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        if (!(bool)uVar2) break;
        ChannelList::ConstIterator::name((ConstIterator *)0x16fec9);
        local_390._M_node =
             (_Base_ptr)
             FrameBuffer::find((FrameBuffer *)in_stack_fffffffffffffba8,
                               (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0)
                              );
        local_398._M_node =
             (_Base_ptr)
             FrameBuffer::end((FrameBuffer *)
                              CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        bVar1 = Imf_3_3::operator==((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        if (bVar1) {
          pCVar6 = ChannelList::ConstIterator::channel((ConstIterator *)0x16ff5e);
          in_stack_fffffffffffffaa0 = 0;
          in_stack_fffffffffffffa98 = 0;
          anon_unknown_5::TOutSliceInfo::TOutSliceInfo
                    (&local_3c8,pCVar6->type,(char *)0x0,0,0,true,0,0);
          std::
          vector<Imf_3_3::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::TOutSliceInfo>_>
          ::push_back((vector<Imf_3_3::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::TOutSliceInfo>_>
                       *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                      (value_type *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        }
        else {
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x16ffeb);
          t = pSVar7->type;
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x17000a);
          pcVar4 = pSVar7->base;
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x17002c);
          xs = pSVar7->xStride;
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x17004e);
          ys = pSVar7->yStride;
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x170070);
          in_stack_fffffffffffffa98 = pSVar7->xTileCoords & 1;
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x170094);
          in_stack_fffffffffffffaa0 = pSVar7->yTileCoords & 1;
          in_stack_fffffffffffffab4 = in_stack_fffffffffffffa98;
          anon_unknown_5::TOutSliceInfo::TOutSliceInfo
                    (&local_3f8,t,pcVar4,xs,ys,false,in_stack_fffffffffffffa98,
                     in_stack_fffffffffffffaa0);
          std::
          vector<Imf_3_3::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::TOutSliceInfo>_>
          ::push_back((vector<Imf_3_3::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::TOutSliceInfo>_>
                       *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                      (value_type *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        }
        ChannelList::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
      }
      FrameBuffer::operator=
                ((FrameBuffer *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                 (FrameBuffer *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      std::
      vector<Imf_3_3::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::TOutSliceInfo>_>
      ::operator=((vector<Imf_3_3::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::TOutSliceInfo>_>
                   *)this_00._M_node,
                  (vector<Imf_3_3::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::TOutSliceInfo>_>
                   *)CONCAT17(uVar2,in_stack_fffffffffffffb38));
      std::
      vector<Imf_3_3::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::TOutSliceInfo>_>
      ::~vector((vector<Imf_3_3::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::TOutSliceInfo>_>
                 *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x170165);
      return;
    }
    ChannelList::ConstIterator::name((ConstIterator *)0x16fa9c);
    local_48._M_node =
         (_Base_ptr)
         FrameBuffer::find((FrameBuffer *)in_stack_fffffffffffffba8,
                           (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    local_50._M_node =
         (_Base_ptr)
         FrameBuffer::end((FrameBuffer *)
                          CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    bVar1 = Imf_3_3::operator==((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    if (!bVar1) {
      pCVar6 = ChannelList::ConstIterator::channel((ConstIterator *)0x16fb52);
      in_stack_fffffffffffffba4 = pCVar6->type;
      in_stack_fffffffffffffba8 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x16fb7a);
      if (in_stack_fffffffffffffba4 != in_stack_fffffffffffffba8->type) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1d8);
        poVar3 = std::operator<<(local_1c8,"Pixel type of \"");
        pcVar4 = ChannelList::ConstIterator::name((ConstIterator *)0x16fbde);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\" channel of output file \"");
        pcVar4 = fileName((TiledOutputFile *)0x16fc32);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::operator<<(poVar3,"\" is not compatible with the frame buffer\'s pixel type.");
        uVar5 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc
                  ((ArgExc *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                   (stringstream *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        __cxa_throw(uVar5,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x16fd0e);
      if ((pSVar7->xSampling != 1) ||
         (pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x16fd33),
         pSVar7->ySampling != 1)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_360);
        std::operator<<(local_350,"All channels in a tiled file must havesampling (1,1).");
        uVar5 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc
                  ((ArgExc *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                   (stringstream *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        __cxa_throw(uVar5,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
    }
    ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
  } while( true );
}

Assistant:

void
TiledOutputFile::setFrameBuffer (const FrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_streamData);
#endif
    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList& channels = _data->header.channels ();

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        FrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ()) continue;

        if (i.channel ().type != j.slice ().type)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Pixel type of \"" << i.name ()
                                   << "\" channel "
                                      "of output file \""
                                   << fileName ()
                                   << "\" is "
                                      "not compatible with the frame buffer's "
                                      "pixel type.");

        if (j.slice ().xSampling != 1 || j.slice ().ySampling != 1)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "All channels in a tiled file must have"
                "sampling (1,1).");
    }

    //
    // Initialize slice table for writePixels().
    //

    vector<TOutSliceInfo> slices;

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        FrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ())
        {
            //
            // Channel i is not present in the frame buffer.
            // In the file, channel i will contain only zeroes.
            //

            slices.push_back (TOutSliceInfo (
                i.channel ().type,
                0,      // base
                0,      // xStride,
                0,      // yStride,
                true)); // zero
        }
        else
        {
            //
            // Channel i is present in the frame buffer.
            //

            slices.push_back (TOutSliceInfo (
                j.slice ().type,
                j.slice ().base,
                j.slice ().xStride,
                j.slice ().yStride,
                false, // zero
                (j.slice ().xTileCoords) ? 1 : 0,
                (j.slice ().yTileCoords) ? 1 : 0));
        }
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;
    _data->slices      = slices;
}